

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O1

bool __thiscall Core::fileCheck(Core *this,string *s)

{
  bool bVar1;
  int iVar2;
  Core *pCVar3;
  _Alloc_hider local_30;
  undefined8 local_20;
  
  bVar1 = Parsing::File::setPath(&this->_f,s);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)this);
    if (iVar2 == 0) {
      return true;
    }
    local_30._M_p = (pointer)&stack0xffffffffffffffe0;
    pCVar3 = (Core *)&stack0xffffffffffffffd0;
    std::__cxx11::string::_M_construct<char_const*>((string *)pCVar3,"This not a UWU file!","");
    error(pCVar3,(string *)&stack0xffffffffffffffd0,false);
  }
  else {
    local_30._M_p = (pointer)&stack0xffffffffffffffe0;
    pCVar3 = (Core *)&stack0xffffffffffffffd0;
    std::__cxx11::string::_M_construct<char_const*>((string *)pCVar3,"There is NOWO file!","");
    error(pCVar3,(string *)&stack0xffffffffffffffd0,false);
  }
  if (local_30._M_p != (pointer)&stack0xffffffffffffffe0) {
    operator_delete(local_30._M_p,local_20 + 1);
  }
  return false;
}

Assistant:

bool Core::fileCheck(const std::string &s)
{
    if (!_f.setPath(s))
        return error("There is NOWO file!");

    if (_f.getExtension() != "UWU")
        return error("This not a UWU file!");

    return true;
}